

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_info.h
# Opt level: O0

vector<long,_std::allocator<long>_> *
pybind11::detail::c_strides
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,
          vector<long,_std::allocator<long>_> *shape,ssize_t itemsize)

{
  long lVar1;
  long lVar2;
  size_type sVar3;
  reference pvVar4;
  const_reference pvVar5;
  size_type local_48;
  size_t i;
  allocator<long> local_2a;
  undefined1 local_29;
  size_type local_28;
  size_type ndim;
  ssize_t itemsize_local;
  vector<long,_std::allocator<long>_> *shape_local;
  vector<long,_std::allocator<long>_> *strides;
  
  ndim = itemsize;
  itemsize_local = (ssize_t)shape;
  shape_local = __return_storage_ptr__;
  sVar3 = std::vector<long,_std::allocator<long>_>::size(shape);
  local_29 = 0;
  local_28 = sVar3;
  std::allocator<long>::allocator(&local_2a);
  std::vector<long,_std::allocator<long>_>::vector
            (__return_storage_ptr__,sVar3,(value_type_conflict2 *)&ndim,&local_2a);
  std::allocator<long>::~allocator(&local_2a);
  sVar3 = local_28;
  if (local_28 != 0) {
    while (local_48 = sVar3 - 1, local_48 != 0) {
      pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](__return_storage_ptr__,local_48)
      ;
      lVar1 = *pvVar4;
      pvVar5 = std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)itemsize_local,local_48);
      lVar2 = *pvVar5;
      pvVar4 = std::vector<long,_std::allocator<long>_>::operator[]
                         (__return_storage_ptr__,sVar3 - 2);
      *pvVar4 = lVar1 * lVar2;
      sVar3 = local_48;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<ssize_t> c_strides(const std::vector<ssize_t> &shape, ssize_t itemsize) {
    auto ndim = shape.size();
    std::vector<ssize_t> strides(ndim, itemsize);
    if (ndim > 0)
        for (size_t i = ndim - 1; i > 0; --i)
            strides[i - 1] = strides[i] * shape[i];
    return strides;
}